

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::contextMenuEvent(QTextEdit *this,QContextMenuEvent *e)

{
  QTextEditPrivate *d;
  QTextEditPrivate *in_stack_00000018;
  
  d_func((QTextEdit *)0x6d418c);
  QTextEditPrivate::sendControlEvent(in_stack_00000018,(QEvent *)this);
  return;
}

Assistant:

void QTextEdit::contextMenuEvent(QContextMenuEvent *e)
{
    Q_D(QTextEdit);
    d->sendControlEvent(e);
}